

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
duckdb_jaro_winkler::common::BlockPatternMatchVector::insert<char_const*>
          (BlockPatternMatchVector *this,char *first,char *last)

{
  BlockPatternMatchVector *this_00;
  long lVar1;
  long in_RDI;
  int64_t pos;
  int64_t block;
  int64_t i;
  int64_t len;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  
  this_00 = (BlockPatternMatchVector *)
            std::distance<char_const*>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  lVar1 = ceildiv<long,int>((long)this_00,0x40);
  *(long *)(in_RDI + 0x30) = lVar1;
  duckdb::std::
  vector<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
  ::resize(&this_00->m_map,in_stack_ffffffffffffffd8);
  duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
             in_stack_ffffffffffffffd8);
  for (lVar1 = 0; lVar1 < (long)this_00; lVar1 = lVar1 + 1) {
    insert<char>(this_00,lVar1,(char)((ulong)(lVar1 / 0x40) >> 0x38),(int)(lVar1 / 0x40));
  }
  return;
}

Assistant:

void insert(InputIt1 first, InputIt1 last)
    {
        int64_t len = std::distance(first, last);
        m_block_count = ceildiv(len, 64);
        m_map.resize(static_cast<size_t>(m_block_count));
        m_extendedAscii.resize(static_cast<size_t>(m_block_count * 256));

        for (int64_t i = 0; i < len; ++i) {
            int64_t block = i / 64;
            int64_t pos = i % 64;
            insert(block, first[i], static_cast<int>(pos));
        }
    }